

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-table.c
# Opt level: O3

void Curl_uint_tbl_init(uint_tbl *tbl,Curl_uint_tbl_entry_dtor *entry_dtor)

{
  tbl->rows = (void **)0x0;
  tbl->entry_dtor = (Curl_uint_tbl_entry_dtor *)0x0;
  tbl->nrows = 0;
  tbl->nentries = 0;
  *(undefined8 *)&tbl->last_key_added = 0;
  tbl->entry_dtor = entry_dtor;
  tbl->last_key_added = 0xffffffff;
  return;
}

Assistant:

void Curl_uint_tbl_init(struct uint_tbl *tbl,
                        Curl_uint_tbl_entry_dtor *entry_dtor)
{
  memset(tbl, 0, sizeof(*tbl));
  tbl->entry_dtor = entry_dtor;
  tbl->last_key_added = UINT_MAX;
#ifdef DEBUGBUILD
  tbl->init = CURL_UINT_TBL_MAGIC;
#endif
}